

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_md5.c
# Opt level: O1

void ngx_md5_final(u_char *result,ngx_md5_t *ctx)

{
  u_char *data;
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)((uint)ctx->bytes & 0x3f);
  data = ctx->buffer;
  lVar1 = uVar2 + 1;
  ctx->buffer[uVar2] = 0x80;
  uVar2 = uVar2 ^ 0x3f;
  if (uVar2 < 8) {
    memset(data + lVar1,0,uVar2);
    uVar2 = 0x40;
    ngx_md5_body(ctx,data,0x40);
    lVar1 = 0;
  }
  memset(data + lVar1,0,uVar2 - 8);
  uVar2 = ctx->bytes;
  ctx->bytes = uVar2 * 8;
  ctx->buffer[0x38] = (u_char)(uVar2 * 8);
  ctx->buffer[0x39] = (u_char)(uVar2 >> 5);
  ctx->buffer[0x3a] = (u_char)(uVar2 >> 0xd);
  ctx->buffer[0x3b] = (u_char)(uVar2 >> 0x15);
  ctx->buffer[0x3c] = (u_char)(uVar2 >> 0x1d);
  ctx->buffer[0x3d] = (u_char)(uVar2 >> 0x25);
  ctx->buffer[0x3e] = (u_char)(uVar2 >> 0x2d);
  ctx->buffer[0x3f] = (u_char)(uVar2 >> 0x35);
  ngx_md5_body(ctx,data,0x40);
  *result = (u_char)ctx->a;
  result[1] = *(u_char *)((long)&ctx->a + 1);
  result[2] = *(u_char *)((long)&ctx->a + 2);
  result[3] = *(u_char *)((long)&ctx->a + 3);
  result[4] = (u_char)ctx->b;
  result[5] = *(u_char *)((long)&ctx->b + 1);
  result[6] = *(u_char *)((long)&ctx->b + 2);
  result[7] = *(u_char *)((long)&ctx->b + 3);
  result[8] = (u_char)ctx->c;
  result[9] = *(u_char *)((long)&ctx->c + 1);
  result[10] = *(u_char *)((long)&ctx->c + 2);
  result[0xb] = *(u_char *)((long)&ctx->c + 3);
  result[0xc] = (u_char)ctx->d;
  result[0xd] = *(u_char *)((long)&ctx->d + 1);
  result[0xe] = *(u_char *)((long)&ctx->d + 2);
  result[0xf] = *(u_char *)((long)&ctx->d + 3);
  ctx->buffer[0x28] = '\0';
  ctx->buffer[0x29] = '\0';
  ctx->buffer[0x2a] = '\0';
  ctx->buffer[0x2b] = '\0';
  ctx->buffer[0x2c] = '\0';
  ctx->buffer[0x2d] = '\0';
  ctx->buffer[0x2e] = '\0';
  ctx->buffer[0x2f] = '\0';
  ctx->buffer[0x30] = '\0';
  ctx->buffer[0x31] = '\0';
  ctx->buffer[0x32] = '\0';
  ctx->buffer[0x33] = '\0';
  ctx->buffer[0x34] = '\0';
  ctx->buffer[0x35] = '\0';
  ctx->buffer[0x36] = '\0';
  ctx->buffer[0x37] = '\0';
  ctx->buffer[0x18] = '\0';
  ctx->buffer[0x19] = '\0';
  ctx->buffer[0x1a] = '\0';
  ctx->buffer[0x1b] = '\0';
  ctx->buffer[0x1c] = '\0';
  ctx->buffer[0x1d] = '\0';
  ctx->buffer[0x1e] = '\0';
  ctx->buffer[0x1f] = '\0';
  ctx->buffer[0x20] = '\0';
  ctx->buffer[0x21] = '\0';
  ctx->buffer[0x22] = '\0';
  ctx->buffer[0x23] = '\0';
  ctx->buffer[0x24] = '\0';
  ctx->buffer[0x25] = '\0';
  ctx->buffer[0x26] = '\0';
  ctx->buffer[0x27] = '\0';
  ctx->buffer[8] = '\0';
  ctx->buffer[9] = '\0';
  ctx->buffer[10] = '\0';
  ctx->buffer[0xb] = '\0';
  ctx->buffer[0xc] = '\0';
  ctx->buffer[0xd] = '\0';
  ctx->buffer[0xe] = '\0';
  ctx->buffer[0xf] = '\0';
  ctx->buffer[0x10] = '\0';
  ctx->buffer[0x11] = '\0';
  ctx->buffer[0x12] = '\0';
  ctx->buffer[0x13] = '\0';
  ctx->buffer[0x14] = '\0';
  ctx->buffer[0x15] = '\0';
  ctx->buffer[0x16] = '\0';
  ctx->buffer[0x17] = '\0';
  ctx->c = 0;
  ctx->d = 0;
  ctx->buffer[0] = '\0';
  ctx->buffer[1] = '\0';
  ctx->buffer[2] = '\0';
  ctx->buffer[3] = '\0';
  ctx->buffer[4] = '\0';
  ctx->buffer[5] = '\0';
  ctx->buffer[6] = '\0';
  ctx->buffer[7] = '\0';
  ctx->bytes = 0;
  ctx->a = 0;
  ctx->b = 0;
  ctx->buffer[0x38] = '\0';
  ctx->buffer[0x39] = '\0';
  ctx->buffer[0x3a] = '\0';
  ctx->buffer[0x3b] = '\0';
  ctx->buffer[0x3c] = '\0';
  ctx->buffer[0x3d] = '\0';
  ctx->buffer[0x3e] = '\0';
  ctx->buffer[0x3f] = '\0';
  return;
}

Assistant:

void
ngx_md5_final(u_char result[16], ngx_md5_t *ctx)
{
    size_t  used, free;

    used = (size_t) (ctx->bytes & 0x3f);

    ctx->buffer[used++] = 0x80;

    free = 64 - used;

    if (free < 8) {
        ngx_memzero(&ctx->buffer[used], free);
        (void) ngx_md5_body(ctx, ctx->buffer, 64);
        used = 0;
        free = 64;
    }

    ngx_memzero(&ctx->buffer[used], free - 8);

    ctx->bytes <<= 3;
    ctx->buffer[56] = (u_char) ctx->bytes;
    ctx->buffer[57] = (u_char) (ctx->bytes >> 8);
    ctx->buffer[58] = (u_char) (ctx->bytes >> 16);
    ctx->buffer[59] = (u_char) (ctx->bytes >> 24);
    ctx->buffer[60] = (u_char) (ctx->bytes >> 32);
    ctx->buffer[61] = (u_char) (ctx->bytes >> 40);
    ctx->buffer[62] = (u_char) (ctx->bytes >> 48);
    ctx->buffer[63] = (u_char) (ctx->bytes >> 56);

    (void) ngx_md5_body(ctx, ctx->buffer, 64);

    result[0] = (u_char) ctx->a;
    result[1] = (u_char) (ctx->a >> 8);
    result[2] = (u_char) (ctx->a >> 16);
    result[3] = (u_char) (ctx->a >> 24);
    result[4] = (u_char) ctx->b;
    result[5] = (u_char) (ctx->b >> 8);
    result[6] = (u_char) (ctx->b >> 16);
    result[7] = (u_char) (ctx->b >> 24);
    result[8] = (u_char) ctx->c;
    result[9] = (u_char) (ctx->c >> 8);
    result[10] = (u_char) (ctx->c >> 16);
    result[11] = (u_char) (ctx->c >> 24);
    result[12] = (u_char) ctx->d;
    result[13] = (u_char) (ctx->d >> 8);
    result[14] = (u_char) (ctx->d >> 16);
    result[15] = (u_char) (ctx->d >> 24);

    ngx_memzero(ctx, sizeof(*ctx));
}